

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

Instr * __thiscall LowererMD::LowerToFloat(LowererMD *this,Instr *instr)

{
  undefined2 uVar1;
  code *pcVar2;
  IRType IVar3;
  IRType IVar4;
  bool bVar5;
  Opnd *pOVar6;
  ThreadContextInfo *pTVar7;
  intptr_t iVar8;
  BranchInstr *instrBranch;
  undefined4 *puVar9;
  OpCode OVar10;
  MemRefOpnd *local_28;
  Opnd *opnd;
  Instr *instr_local;
  LowererMD *this_local;
  
  uVar1 = instr->m_opcode;
  if (((ushort)(uVar1 - 0xc) < 2) || ((ushort)(uVar1 - 0x10) < 6)) {
LAB_00892af8:
    instrBranch = IR::Instr::AsBranchInstr(instr);
    this_local = (LowererMD *)LowerFloatCondBranch(instrBranch,false);
  }
  else {
    if (uVar1 == 0x28) {
      instr->m_opcode = XORPS;
      pOVar6 = IR::Instr::GetDst(instr);
      bVar5 = IR::Opnd::IsFloat32(pOVar6);
      if (bVar5) {
        pTVar7 = Func::GetThreadContextInfo(this->m_func);
        iVar8 = ThreadContextInfo::GetMaskNegFloatAddr(pTVar7);
        local_28 = IR::MemRefOpnd::New(iVar8,TyFloat32,this->m_func,AddrOpndKindDynamicFloatRef);
      }
      else {
        pOVar6 = IR::Instr::GetDst(instr);
        bVar5 = IR::Opnd::IsFloat64(pOVar6);
        if (!bVar5) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                             ,0x1e26,"(instr->GetDst()->IsFloat64())","instr->GetDst()->IsFloat64()"
                            );
          if (!bVar5) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        pTVar7 = Func::GetThreadContextInfo(this->m_func);
        iVar8 = ThreadContextInfo::GetMaskNegDoubleAddr(pTVar7);
        local_28 = IR::MemRefOpnd::New(iVar8,TyFloat64,this->m_func,AddrOpndKindDynamicDoubleRef);
      }
      IR::Instr::SetSrc2(instr,&local_28->super_Opnd);
    }
    else if (uVar1 == 0x2d) {
      pOVar6 = IR::Instr::GetDst(instr);
      IVar3 = IR::Opnd::GetType(pOVar6);
      pOVar6 = IR::Instr::GetSrc1(instr);
      IVar4 = IR::Opnd::GetType(pOVar6);
      if (IVar3 != IVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x1e05,"(instr->GetDst()->GetType() == instr->GetSrc1()->GetType())",
                           "instr->GetDst()->GetType() == instr->GetSrc1()->GetType()");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      pOVar6 = IR::Instr::GetSrc1(instr);
      IVar3 = IR::Opnd::GetType(pOVar6);
      pOVar6 = IR::Instr::GetSrc2(instr);
      IVar4 = IR::Opnd::GetType(pOVar6);
      if (IVar3 != IVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x1e06,"(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType())",
                           "instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType()");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      pOVar6 = IR::Instr::GetSrc1(instr);
      bVar5 = IR::Opnd::IsFloat64(pOVar6);
      OVar10 = ADDSS;
      if (bVar5) {
        OVar10 = ADDSD;
      }
      instr->m_opcode = OVar10;
    }
    else if (uVar1 == 0x2e) {
      pOVar6 = IR::Instr::GetDst(instr);
      IVar3 = IR::Opnd::GetType(pOVar6);
      pOVar6 = IR::Instr::GetSrc1(instr);
      IVar4 = IR::Opnd::GetType(pOVar6);
      if (IVar3 != IVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x1e17,"(instr->GetDst()->GetType() == instr->GetSrc1()->GetType())",
                           "instr->GetDst()->GetType() == instr->GetSrc1()->GetType()");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      pOVar6 = IR::Instr::GetSrc1(instr);
      IVar3 = IR::Opnd::GetType(pOVar6);
      pOVar6 = IR::Instr::GetSrc2(instr);
      IVar4 = IR::Opnd::GetType(pOVar6);
      if (IVar3 != IVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x1e18,"(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType())",
                           "instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType()");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      pOVar6 = IR::Instr::GetSrc1(instr);
      bVar5 = IR::Opnd::IsFloat64(pOVar6);
      OVar10 = DIVSS;
      if (bVar5) {
        OVar10 = DIVSD;
      }
      instr->m_opcode = OVar10;
    }
    else if (uVar1 == 0x30) {
      pOVar6 = IR::Instr::GetDst(instr);
      IVar3 = IR::Opnd::GetType(pOVar6);
      pOVar6 = IR::Instr::GetSrc1(instr);
      IVar4 = IR::Opnd::GetType(pOVar6);
      if (IVar3 != IVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x1e11,"(instr->GetDst()->GetType() == instr->GetSrc1()->GetType())",
                           "instr->GetDst()->GetType() == instr->GetSrc1()->GetType()");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      pOVar6 = IR::Instr::GetSrc1(instr);
      IVar3 = IR::Opnd::GetType(pOVar6);
      pOVar6 = IR::Instr::GetSrc2(instr);
      IVar4 = IR::Opnd::GetType(pOVar6);
      if (IVar3 != IVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x1e12,"(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType())",
                           "instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType()");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      pOVar6 = IR::Instr::GetSrc1(instr);
      bVar5 = IR::Opnd::IsFloat64(pOVar6);
      OVar10 = MULSS;
      if (bVar5) {
        OVar10 = MULSD;
      }
      instr->m_opcode = OVar10;
    }
    else if (uVar1 == 0x33) {
      pOVar6 = IR::Instr::GetDst(instr);
      IVar3 = IR::Opnd::GetType(pOVar6);
      pOVar6 = IR::Instr::GetSrc1(instr);
      IVar4 = IR::Opnd::GetType(pOVar6);
      if (IVar3 != IVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x1e0b,"(instr->GetDst()->GetType() == instr->GetSrc1()->GetType())",
                           "instr->GetDst()->GetType() == instr->GetSrc1()->GetType()");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      pOVar6 = IR::Instr::GetSrc1(instr);
      IVar3 = IR::Opnd::GetType(pOVar6);
      pOVar6 = IR::Instr::GetSrc2(instr);
      IVar4 = IR::Opnd::GetType(pOVar6);
      if (IVar3 != IVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x1e0c,"(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType())",
                           "instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType()");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      pOVar6 = IR::Instr::GetSrc1(instr);
      bVar5 = IR::Opnd::IsFloat64(pOVar6);
      OVar10 = SUBSS;
      if (bVar5) {
        OVar10 = SUBSD;
      }
      instr->m_opcode = OVar10;
    }
    else {
      if ((ushort)(uVar1 - 0x194) < 8) goto LAB_00892af8;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1e40,"((0))","(0)");
      if (!bVar5) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    Legalize<false>(instr,false);
    this_local = (LowererMD *)instr;
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
LowererMD::LowerToFloat(IR::Instr *instr)
{
    switch (instr->m_opcode)
    {
    case Js::OpCode::Add_A:
        Assert(instr->GetDst()->GetType() == instr->GetSrc1()->GetType());
        Assert(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType());
        instr->m_opcode = instr->GetSrc1()->IsFloat64() ? Js::OpCode::ADDSD : Js::OpCode::ADDSS;
        break;

    case Js::OpCode::Sub_A:
        Assert(instr->GetDst()->GetType() == instr->GetSrc1()->GetType());
        Assert(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType());
        instr->m_opcode = instr->GetSrc1()->IsFloat64() ? Js::OpCode::SUBSD : Js::OpCode::SUBSS;
        break;

    case Js::OpCode::Mul_A:
        Assert(instr->GetDst()->GetType() == instr->GetSrc1()->GetType());
        Assert(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType());
        instr->m_opcode = instr->GetSrc1()->IsFloat64() ? Js::OpCode::MULSD : Js::OpCode::MULSS;
        break;

    case Js::OpCode::Div_A:
        Assert(instr->GetDst()->GetType() == instr->GetSrc1()->GetType());
        Assert(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType());
        instr->m_opcode = instr->GetSrc1()->IsFloat64() ? Js::OpCode::DIVSD : Js::OpCode::DIVSS;
        break;

    case Js::OpCode::Neg_A:
    {
        IR::Opnd *opnd;
        instr->m_opcode = Js::OpCode::XORPS;
        if (instr->GetDst()->IsFloat32())
        {
            opnd = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetMaskNegFloatAddr(), TyFloat32, this->m_func, IR::AddrOpndKindDynamicFloatRef);
        }
        else
        {
            Assert(instr->GetDst()->IsFloat64());
            opnd = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetMaskNegDoubleAddr(), TyMachDouble, this->m_func, IR::AddrOpndKindDynamicDoubleRef);
        }
        instr->SetSrc2(opnd);
        break;
    }

    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrGt_A:
    case Js::OpCode::BrGe_A:
    case Js::OpCode::BrLt_A:
    case Js::OpCode::BrLe_A:
    case Js::OpCode::BrNotEq_A:
    case Js::OpCode::BrNotNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::BrSrNotNeq_A:
    case Js::OpCode::BrNotGt_A:
    case Js::OpCode::BrNotGe_A:
    case Js::OpCode::BrNotLt_A:
    case Js::OpCode::BrNotLe_A:
        return this->LowerFloatCondBranch(instr->AsBranchInstr());

    default:
        Assume(UNREACHED);
    }

    Legalize(instr);

    return instr;
}